

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v7::format_system_error(buffer<char> *out,int error_code,string_view message)

{
  int iVar1;
  char **in_R8;
  undefined1 local_268 [8];
  memory_buffer buf;
  string_view message_local;
  char *system_message;
  
  message_local.data_ = (char *)message.size_;
  buf._528_8_ = message.data_;
  buf.super_buffer<char>._vptr_buffer = (_func_int **)&buf.super_buffer<char>.capacity_;
  buf.super_buffer<char>.ptr_ = (char *)0x0;
  local_268 = (undefined1  [8])&PTR_grow_002b5bf8;
  buf.super_buffer<char>.size_ = 500;
  detail::buffer<char>::try_resize((buffer<char> *)local_268,500);
  while( true ) {
    message_local.size_ = (size_t)buf.super_buffer<char>._vptr_buffer;
    iVar1 = detail::safe_strerror
                      (error_code,(char **)&message_local.size_,(size_t)buf.super_buffer<char>.ptr_)
    ;
    if (iVar1 != 0x22) break;
    detail::buffer<char>::try_resize
              ((buffer<char> *)local_268,(long)buf.super_buffer<char>.ptr_ * 2);
  }
  if (iVar1 == 0) {
    format_to<fmt::v7::detail::buffer_appender<char>,_char[7],_fmt::v7::basic_string_view<char>_&,_char_*&,_0>
              ((v7 *)out,(buffer_appender<char>)0x2270ad,(char (*) [7])(buf.store_ + 0x1f0),
               (basic_string_view<char> *)&message_local.size_,in_R8);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_268);
  }
  else {
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_268);
    detail::format_error_code(out,error_code,message);
  }
  return;
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          detail::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        format_to(detail::buffer_appender<char>(out), "{}: {}", message,
                  system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }